

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::updateCompositionMode(QOpenGL2PaintEngineExPrivate *this)

{
  uint dfactor;
  OpenGLFeature OVar1;
  ulong uVar2;
  QOpenGL2PaintEngineState *pQVar3;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffff98;
  GLenum cap;
  QOpenGLEngineShaderManager *in_stack_ffffffffffffffa0;
  QMessageLogger *this_00;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QPointer<QOpenGLContext>::operator->((QPointer<QOpenGLContext> *)0x15da11);
  OVar1 = QOpenGLContext::functions();
  uVar2 = QOpenGLFunctions::hasOpenGLFeature(OVar1);
  if ((uVar2 & 1) == 0) {
    pQVar3 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x15dacd);
    if (0xc < *(int *)&pQVar3->field_0x1b4) {
      QMessageLogger::QMessageLogger
                (this_00,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                 in_stack_ffffffffffffff98);
      QMessageLogger::warning(local_28,"Unsupported composition mode");
      *(undefined1 *)&in_RDI[0x13].context.line = 0;
      goto LAB_0015de1d;
    }
  }
  else {
    pQVar3 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x15da40);
    cap = (GLenum)((ulong)in_stack_ffffffffffffff98 >> 0x20);
    if (*(int *)&pQVar3->field_0x1b4 < 0xd) {
      QOpenGLFunctions::glDisable((QOpenGLFunctions *)in_stack_ffffffffffffffa0,cap);
      QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,cap);
    }
    else {
      QOpenGLFunctions::glEnable((QOpenGLFunctions *)in_stack_ffffffffffffffa0,cap);
    }
    in_stack_ffffffffffffffa0 = (QOpenGLEngineShaderManager *)in_RDI[0x11].context.function;
    pQVar3 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x15daaa);
    QOpenGLEngineShaderManager::setCompositionMode
              (in_stack_ffffffffffffffa0,*(CompositionMode *)&pQVar3->field_0x1b4);
  }
  pQVar3 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x15db20);
  dfactor = *(uint *)&pQVar3->field_0x1b4;
  switch((char *)(ulong)dfactor) {
  case (char *)0x0:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x1:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x2:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x3:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x4:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x5:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x6:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x7:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x8:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0x9:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0xa:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0xb:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0xc:
    QOpenGLFunctions::glBlendFunc((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0,dfactor);
    break;
  case (char *)0xd:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0xe:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0xf:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x10:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x11:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x12:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x13:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x14:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x15:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x16:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  case (char *)0x17:
    QOpenGLFunctions::glBlendEquation((QOpenGLFunctions *)in_stack_ffffffffffffffa0,0);
    break;
  default:
    QMessageLogger::QMessageLogger
              (this_00,(char *)in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
               (char *)(ulong)dfactor);
    QMessageLogger::warning(local_48,"Unsupported composition mode");
  }
  *(undefined1 *)&in_RDI[0x13].context.line = 0;
LAB_0015de1d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::updateCompositionMode()
{
    // NOTE: The entire paint engine works on pre-multiplied data - which is why some of these
    //       composition modes look odd.
//     qDebug() << "QOpenGL2PaintEngineExPrivate::updateCompositionMode() - Setting GL composition mode for " << q->state()->composition_mode;
    if (ctx->functions()->hasOpenGLFeature(QOpenGLFunctions::BlendEquationAdvanced)) {
       if (q->state()->composition_mode <= QPainter::CompositionMode_Plus) {
           funcs.glDisable(GL_BLEND_ADVANCED_COHERENT_KHR);
           funcs.glBlendEquation(GL_FUNC_ADD);
       } else {
           funcs.glEnable(GL_BLEND_ADVANCED_COHERENT_KHR);
       }
       shaderManager->setCompositionMode(q->state()->composition_mode);
    } else {
        if (q->state()->composition_mode > QPainter::CompositionMode_Plus) {
            qWarning("Unsupported composition mode");
            compositionModeDirty = false;
            return;
        }
    }
    switch(q->state()->composition_mode) {
    case QPainter::CompositionMode_SourceOver:
        funcs.glBlendFunc(GL_ONE, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_DestinationOver:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE);
        break;
    case QPainter::CompositionMode_Clear:
        funcs.glBlendFunc(GL_ZERO, GL_ZERO);
        break;
    case QPainter::CompositionMode_Source:
        funcs.glBlendFunc(GL_ONE, GL_ZERO);
        break;
    case QPainter::CompositionMode_Destination:
        funcs.glBlendFunc(GL_ZERO, GL_ONE);
        break;
    case QPainter::CompositionMode_SourceIn:
        funcs.glBlendFunc(GL_DST_ALPHA, GL_ZERO);
        break;
    case QPainter::CompositionMode_DestinationIn:
        funcs.glBlendFunc(GL_ZERO, GL_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_SourceOut:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ZERO);
        break;
    case QPainter::CompositionMode_DestinationOut:
        funcs.glBlendFunc(GL_ZERO, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_SourceAtop:
        funcs.glBlendFunc(GL_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_DestinationAtop:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_Xor:
        funcs.glBlendFunc(GL_ONE_MINUS_DST_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
        break;
    case QPainter::CompositionMode_Plus:
        funcs.glBlendFunc(GL_ONE, GL_ONE);
        break;
    case QPainter::CompositionMode_Multiply:
        funcs.glBlendEquation(GL_MULTIPLY_KHR);
        break;
    case QPainter::CompositionMode_Screen:
        funcs.glBlendEquation(GL_SCREEN_KHR);
        break;
    case QPainter::CompositionMode_Overlay:
        funcs.glBlendEquation(GL_OVERLAY_KHR);
        break;
    case QPainter::CompositionMode_Darken:
        funcs.glBlendEquation(GL_DARKEN_KHR);
        break;
    case QPainter::CompositionMode_Lighten:
        funcs.glBlendEquation(GL_LIGHTEN_KHR);
        break;
    case QPainter::CompositionMode_ColorDodge:
        funcs.glBlendEquation(GL_COLORDODGE_KHR);
        break;
    case QPainter::CompositionMode_ColorBurn:
        funcs.glBlendEquation(GL_COLORBURN_KHR);
        break;
    case QPainter::CompositionMode_HardLight:
        funcs.glBlendEquation(GL_HARDLIGHT_KHR);
        break;
    case QPainter::CompositionMode_SoftLight:
        funcs.glBlendEquation(GL_SOFTLIGHT_KHR);
        break;
    case QPainter::CompositionMode_Difference:
        funcs.glBlendEquation(GL_DIFFERENCE_KHR);
        break;
    case QPainter::CompositionMode_Exclusion:
        funcs.glBlendEquation(GL_EXCLUSION_KHR);
        break;
    default:
        qWarning("Unsupported composition mode");
        break;
    }

    compositionModeDirty = false;
}